

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  Chapter *pCVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Chapter *this_00;
  int *in_RDI;
  ulong uVar6;
  Chapter *dst;
  Chapter *src;
  int idx;
  Chapter *chapters;
  int size;
  Chapter *local_b0;
  Chapter *local_88;
  int local_7c;
  int local_60;
  bool local_1;
  
  if (in_RDI[1] < *in_RDI) {
    local_1 = true;
  }
  else {
    if (*in_RDI == 0) {
      local_7c = 1;
    }
    else {
      local_7c = *in_RDI << 1;
    }
    uVar3 = (ulong)local_7c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x30),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_88 = (Chapter *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_88 = (Chapter *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_b0 = local_88;
        do {
          Chapter::Chapter(local_b0);
          local_b0 = local_b0 + 1;
        } while (local_b0 != local_88 + uVar3);
      }
    }
    if (local_88 == (Chapter *)0x0) {
      local_1 = false;
    }
    else {
      for (local_60 = 0; local_60 < in_RDI[1]; local_60 = local_60 + 1) {
        Chapter::ShallowCopy
                  ((Chapter *)(*(long *)(in_RDI + 2) + (long)local_60 * 0x30),local_88 + local_60);
      }
      pCVar1 = *(Chapter **)(in_RDI + 2);
      if (pCVar1 != (Chapter *)0x0) {
        this_00 = pCVar1 + *(long *)&pCVar1[-1].displays_size_;
        while (pCVar1 != this_00) {
          this_00 = this_00 + -1;
          Chapter::~Chapter(this_00);
        }
        operator_delete__(&pCVar1[-1].displays_size_);
      }
      *(Chapter **)(in_RDI + 2) = local_88;
      *in_RDI = local_7c;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}